

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O3

int duckdb_lz4::LZ4_decompress_fast_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int originalSize)

{
  int iVar1;
  BYTE *dictStart;
  size_t prefixSize;
  
  prefixSize = (LZ4_streamDecode->internal_donotuse).prefixSize;
  if (prefixSize == 0) {
    dictStart = (BYTE *)0x0;
    prefixSize = 0;
  }
  else {
    if ((LZ4_streamDecode->internal_donotuse).prefixEnd == (LZ4_byte *)dest) {
      iVar1 = LZ4_decompress_unsafe_generic
                        ((BYTE *)source,(BYTE *)dest,originalSize,prefixSize,
                         (LZ4_streamDecode->internal_donotuse).externalDict,
                         (LZ4_streamDecode->internal_donotuse).extDictSize);
      if (iVar1 < 1) {
        return iVar1;
      }
      (LZ4_streamDecode->internal_donotuse).prefixSize =
           (LZ4_streamDecode->internal_donotuse).prefixSize + (long)originalSize;
      (LZ4_streamDecode->internal_donotuse).prefixEnd =
           (LZ4_streamDecode->internal_donotuse).prefixEnd + originalSize;
      return iVar1;
    }
    (LZ4_streamDecode->internal_donotuse).extDictSize = prefixSize;
    dictStart = (LZ4_streamDecode->internal_donotuse).prefixEnd + -prefixSize;
    (LZ4_streamDecode->internal_donotuse).externalDict = dictStart;
  }
  iVar1 = LZ4_decompress_unsafe_generic
                    ((BYTE *)source,(BYTE *)dest,originalSize,0,dictStart,prefixSize);
  if (0 < iVar1) {
    (LZ4_streamDecode->internal_donotuse).prefixSize = (long)originalSize;
    (LZ4_streamDecode->internal_donotuse).prefixEnd = (LZ4_byte *)(dest + originalSize);
  }
  return iVar1;
}

Assistant:

LZ4_FORCE_O2 int
LZ4_decompress_fast_continue (LZ4_streamDecode_t* LZ4_streamDecode,
                        const char* source, char* dest, int originalSize)
{
    LZ4_streamDecode_t_internal* const lz4sd =
        (assert(LZ4_streamDecode!=NULL), &LZ4_streamDecode->internal_donotuse);
    int result;

    DEBUGLOG(5, "LZ4_decompress_fast_continue (toDecodeSize=%i)", originalSize);
    assert(originalSize >= 0);

    if (lz4sd->prefixSize == 0) {
        DEBUGLOG(5, "first invocation : no prefix nor extDict");
        assert(lz4sd->extDictSize == 0);
        result = LZ4_decompress_fast(source, dest, originalSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)originalSize;
        lz4sd->prefixEnd = (BYTE*)dest + originalSize;
    } else if (lz4sd->prefixEnd == (BYTE*)dest) {
        DEBUGLOG(5, "continue using existing prefix");
        result = LZ4_decompress_unsafe_generic(
                        (const BYTE*)source, (BYTE*)dest, originalSize,
                        lz4sd->prefixSize,
                        lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += (size_t)originalSize;
        lz4sd->prefixEnd  += originalSize;
    } else {
        DEBUGLOG(5, "prefix becomes extDict");
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_fast_extDict(source, dest, originalSize,
                                             lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)originalSize;
        lz4sd->prefixEnd  = (BYTE*)dest + originalSize;
    }

    return result;
}